

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

UText * __thiscall
icu_63::RegexMatcher::group
          (RegexMatcher *this,int32_t groupNum,UText *dest,int64_t *group_len,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  long lVar3;
  int64_t __offset;
  int64_t iStack_48;
  int32_t groupOffset;
  int64_t e;
  int64_t s;
  UErrorCode *status_local;
  int64_t *group_len_local;
  UText *dest_local;
  int32_t groupNum_local;
  RegexMatcher *this_local;
  
  *group_len = 0;
  UVar1 = ::U_FAILURE(*status);
  this_local = (RegexMatcher *)dest;
  if (UVar1 == '\0') {
    UVar1 = ::U_FAILURE(this->fDeferredStatus);
    if (UVar1 == '\0') {
      if (this->fMatch == '\0') {
        *status = U_REGEX_INVALID_STATE;
      }
      else if ((groupNum < 0) ||
              (iVar2 = UVector32::size(this->fPattern->fGroupMap), iVar2 < groupNum)) {
        *status = U_INDEX_OUTOFBOUNDS_ERROR;
      }
    }
    else {
      *status = this->fDeferredStatus;
    }
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      if (groupNum == 0) {
        e = this->fMatchStart;
        iStack_48 = this->fMatchEnd;
      }
      else {
        iVar2 = UVector32::elementAti(this->fPattern->fGroupMap,groupNum + -1);
        e = this->fFrame->fExtra[iVar2];
        iStack_48 = this->fFrame->fExtra[iVar2 + 1];
      }
      if (e < 0) {
        this_local = (RegexMatcher *)utext_clone_63(dest,this->fInputText,'\0','\x01',status);
      }
      else {
        *group_len = iStack_48 - e;
        this_local = (RegexMatcher *)utext_clone_63(dest,this->fInputText,'\0','\x01',status);
        if (this_local != (RegexMatcher *)0x0) {
          lVar3 = e - (long)this_local->fInputText;
          if (((lVar3 < 0) || (*(int32_t *)((long)&this_local->fInput + 4) <= lVar3)) ||
             (0xdbff < (ushort)((UChar *)this_local->fInputLength)[lVar3])) {
            utext_setNativeIndex_63((UText *)this_local,e);
          }
          else {
            *(int32_t *)&this_local->fAltInputText = (int32_t)lVar3;
          }
        }
      }
    }
  }
  return (UText *)this_local;
}

Assistant:

UText *RegexMatcher::group(int32_t groupNum, UText *dest, int64_t &group_len, UErrorCode &status) const {
    group_len = 0;
    if (U_FAILURE(status)) {
        return dest;
    }
    if (U_FAILURE(fDeferredStatus)) {
        status = fDeferredStatus;
    } else if (fMatch == FALSE) {
        status = U_REGEX_INVALID_STATE;
    } else if (groupNum < 0 || groupNum > fPattern->fGroupMap->size()) {
        status = U_INDEX_OUTOFBOUNDS_ERROR;
    }

    if (U_FAILURE(status)) {
        return dest;
    }

    int64_t s, e;
    if (groupNum == 0) {
        s = fMatchStart;
        e = fMatchEnd;
    } else {
        int32_t groupOffset = fPattern->fGroupMap->elementAti(groupNum-1);
        U_ASSERT(groupOffset < fPattern->fFrameSize);
        U_ASSERT(groupOffset >= 0);
        s = fFrame->fExtra[groupOffset];
        e = fFrame->fExtra[groupOffset+1];
    }

    if (s < 0) {
        // A capture group wasn't part of the match
        return utext_clone(dest, fInputText, FALSE, TRUE, &status);
    }
    U_ASSERT(s <= e);
    group_len = e - s;

    dest = utext_clone(dest, fInputText, FALSE, TRUE, &status);
    if (dest)
        UTEXT_SETNATIVEINDEX(dest, s);
    return dest;
}